

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

void __thiscall QThreadPool::start(QThreadPool *this,QRunnable *runnable,int priority)

{
  QThreadPoolPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (runnable != (QRunnable *)0x0) {
    this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
    local_30._0_8_ = &this_00->mutex;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
    local_30[8] = true;
    bVar1 = QThreadPoolPrivate::tryStart(this_00,runnable);
    if (!bVar1) {
      QThreadPoolPrivate::enqueueTask(this_00,runnable,priority);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::start(QRunnable *runnable, int priority)
{
    if (!runnable)
        return;

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);

    if (!d->tryStart(runnable))
        d->enqueueTask(runnable, priority);
}